

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O3

string * __thiscall
Settings::fileToFix_abi_cxx11_(string *__return_storage_ptr__,Settings *this,int n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = files_abi_cxx11_;
  lVar3 = (long)(int)this * 0x20;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *(long *)(lVar2 + lVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,*(long *)(lVar2 + 8 + lVar3) + lVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string fileToFix(const int n){ return files[n]; }